

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# job.c
# Opt level: O2

void collect_jobs(pmtr_t *cfg,UT_string *sm)

{
  ulong uVar1;
  code *pcVar2;
  job_t *pjVar3;
  uint uVar4;
  __pid_t __pid;
  undefined8 in_RAX;
  job_t *pjVar5;
  time_t tVar6;
  ulong uVar7;
  pid_t pVar8;
  UT_array *pUVar9;
  ulong uVar10;
  long lVar11;
  undefined8 uStack_38;
  int es;
  
  uStack_38 = in_RAX;
  do {
    do {
      while( true ) {
        while( true ) {
          while( true ) {
            uVar4 = waitpid(-1,&es,1);
            if ((int)uVar4 < 1) {
              return;
            }
            if (uVar4 != cfg->dm_pid) break;
            if ((es & 0xff7fU) == 0x2100) {
              pVar8 = 0;
              syslog(6,"inotify-based dependency monitoring disabled");
            }
            else {
              pVar8 = dep_monitor(cfg->file);
            }
            cfg->dm_pid = pVar8;
          }
          if (uVar4 != cfg->logger_pid) break;
          __pid = getpid();
          kill(__pid,0xf);
        }
        pjVar5 = get_job_by_pid(cfg->jobs,uVar4);
        if (pjVar5 != (job_t *)0x0) break;
        syslog(3,"sigchld for unknown pid %d",(ulong)uVar4);
      }
      pjVar5->pid = 0;
      pjVar5->terminate = 0;
      tVar6 = time((time_t *)0x0);
      lVar11 = tVar6 + 10;
      if (9 < (int)tVar6 - (int)pjVar5->start_ts) {
        lVar11 = tVar6;
      }
      pjVar5->start_at = lVar11;
      if (pjVar5->once != 0) {
        pjVar5->respawn = 0;
      }
      sm->i = 0;
      *sm->d = '\0';
      utstring_printf(sm,"job %s [%d] exited after %d sec: ",pjVar5->name,(ulong)uVar4);
      if (0x1ffffff < (int)((es & 0x7fU) * 0x1000000 + 0x1000000)) {
        utstring_printf(sm,"signal %d");
      }
      if ((es & 0x7fU) == 0) {
        if (((uint)es >> 8 & 0xff) == 0x21) {
          pjVar5->respawn = 0;
        }
        utstring_printf(sm,"exit status %d");
      }
      syslog(6,"%s",sm->d);
    } while (pjVar5->delete_when_collected == 0);
    pUVar9 = cfg->jobs;
    pcVar2 = (code *)(pUVar9->icd).dtor;
    if (pcVar2 != (code *)0x0) {
      pjVar3 = (job_t *)pUVar9->d;
      uVar7 = (long)pjVar5 - (long)pjVar3;
      if (pjVar5 < pjVar3) {
        lVar11 = 0;
      }
      else {
        uVar1 = (pUVar9->icd).sz;
        lVar11 = 0;
        if (uVar7 / uVar1 < (ulong)pUVar9->i) {
          lVar11 = (long)pjVar3 + (uVar7 - uVar7 % uVar1);
        }
      }
      (*pcVar2)(lVar11);
      pUVar9 = cfg->jobs;
    }
    uVar4 = pUVar9->i;
    pjVar3 = (job_t *)pUVar9->d;
    uVar7 = (long)pjVar5 - (long)pjVar3;
    if (pjVar5 < pjVar3) {
      if (uVar4 == 0) {
        uVar4 = 0;
      }
      else {
        uVar10 = (pUVar9->icd).sz;
        lVar11 = -uVar10;
        uVar7 = 0;
        pjVar5 = pjVar3;
LAB_001059ed:
        memmove((void *)((long)&pjVar3->name + lVar11),pjVar5,(uVar7 + uVar4) * uVar10);
        pUVar9 = cfg->jobs;
        uVar4 = pUVar9->i;
      }
    }
    else {
      uVar10 = (pUVar9->icd).sz;
      uVar1 = uVar7 / uVar10 + 1;
      if (uVar1 < uVar4) {
        lVar11 = uVar7 - uVar7 % uVar10;
        pjVar5 = (job_t *)((long)&pjVar3->name + uVar1 * uVar10);
        uVar7 = ~(uVar7 / uVar10);
        goto LAB_001059ed;
      }
    }
    pUVar9->i = uVar4 - 1;
  } while( true );
}

Assistant:

void collect_jobs(pmtr_t *cfg, UT_string *sm) {
  int es, ex, elapsed;
  time_t now;
  job_t *job;
  pid_t pid;

  while ( (pid = waitpid(-1, &es, WNOHANG)) > 0) {

    /* respawn if it's our dependency monitor, unless its flagged */
    if (pid==cfg->dm_pid) { 
      if (WIFEXITED(es) && ((WEXITSTATUS(es)) == PMTR_NO_RESTART)) {
        syslog(LOG_INFO, "inotify-based dependency monitoring disabled");
        cfg->dm_pid = 0;
      } else {
        cfg->dm_pid = dep_monitor(cfg->file);
      }
      continue;
    }
    /* if it's our logger sub process ... */
    if (pid==cfg->logger_pid) { 
      kill(getpid(), 15); /* induce graceful shutdown in main loop */
      continue;
    }
    /* find the job.  we should always find it by pid. */
    job = get_job_by_pid(cfg->jobs, pid);
    if (!job) {
      syslog(LOG_ERR,"sigchld for unknown pid %d",(int)pid); 
      continue;
    }
    /* decide if and when it should be restarted */
    job->pid = 0;
    job->terminate = 0; /* any termination request has succeeded */
    now = time(NULL);
    elapsed = now - job->start_ts;
    job->start_at = (elapsed < SHORT_DELAY) ? (now+SHORT_DELAY) : now;
    if (job->once) job->respawn=0;

    /* write a log message about how the job exited */
    utstring_clear(sm);
    utstring_printf(sm,"job %s [%d] exited after %d sec: ", job->name, 
      (int)pid, elapsed);
    if (WIFSIGNALED(es)) utstring_printf(sm, "signal %d", (int)WTERMSIG(es));
    if (WIFEXITED(es)) {
      if ( (ex = WEXITSTATUS(es)) == PMTR_NO_RESTART) job->respawn=0;
      utstring_printf(sm,"exit status %d", ex);
    }
    syslog(LOG_INFO,"%s",utstring_body(sm));

    /* is this a former job that was deleted from the config file? */
    if (job->delete_when_collected) {
      utarray_erase(cfg->jobs, utarray_eltidx(cfg->jobs,job), 1);
      job=NULL;
    }
  }
}